

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_arithm<unsigned_long>
               (uint length,unsigned_long value1,unsigned_long value2,bool allowTrash)

{
  element_type eVar1;
  element_type eVar2;
  element_type eVar3;
  element_type eVar4;
  element_type eVar5;
  element_type eVar6;
  element_type eVar7;
  element_type eVar8;
  element_type eVar9;
  element_type eVar10;
  element_type eVar11;
  element_type eVar12;
  element_type eVar13;
  element_type eVar14;
  bool bVar15;
  int iVar16;
  unsigned_long *puVar17;
  element_type *pSrc1;
  element_type *pSrc2;
  element_type *pDst;
  undefined8 *puVar18;
  uint local_1b58;
  uint local_1b54;
  uint i_10;
  uint i_9;
  uint i_8;
  uint i_7;
  uint i_6;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  unsigned_long r;
  uint i;
  unsigned_long *result;
  unsigned_long *v2;
  unsigned_long *v1;
  shared_ptr<unsigned_long> presult;
  undefined1 local_1ae8 [8];
  shared_ptr<unsigned_long> pv2;
  shared_ptr<unsigned_long> pv1;
  bool allowTrash_local;
  unsigned_long value2_local;
  unsigned_long value1_local;
  uint length_local;
  unsigned_long local_1a98;
  unsigned_long uStack_1a90;
  uint local_1a84;
  element_type *local_1a80;
  unsigned_long local_1a78;
  int local_1a6c;
  element_type *local_1a68;
  unsigned_long *local_1a60;
  unsigned_long local_1a58;
  unsigned_long uStack_1a50;
  unsigned_long local_1a48;
  unsigned_long uStack_1a40;
  unsigned_long local_1a38;
  unsigned_long uStack_1a30;
  unsigned_long local_1a28;
  unsigned_long uStack_1a20;
  unsigned_long local_1a18;
  unsigned_long uStack_1a10;
  unsigned_long local_1a08;
  unsigned_long uStack_1a00;
  unsigned_long local_19f8;
  unsigned_long uStack_19f0;
  unsigned_long local_19e8;
  unsigned_long uStack_19e0;
  element_type *local_19d0;
  unsigned_long local_19c8;
  unsigned_long uStack_19c0;
  element_type *local_19b0;
  unsigned_long local_19a8;
  unsigned_long uStack_19a0;
  element_type *local_1990;
  unsigned_long local_1988;
  unsigned_long uStack_1980;
  element_type *local_1970;
  unsigned_long local_1968;
  unsigned_long uStack_1960;
  element_type *local_1950;
  unsigned_long local_1948;
  unsigned_long uStack_1940;
  element_type *local_1930;
  unsigned_long local_1928;
  unsigned_long uStack_1920;
  element_type *local_1910;
  unsigned_long local_1908;
  unsigned_long uStack_1900;
  element_type *local_18f0;
  unsigned_long local_18e8;
  unsigned_long uStack_18e0;
  element_type *local_18d0;
  unsigned_long local_18c8;
  unsigned_long uStack_18c0;
  element_type *local_18b0;
  unsigned_long local_18a8;
  unsigned_long uStack_18a0;
  element_type *local_1890;
  unsigned_long local_1888;
  unsigned_long uStack_1880;
  element_type *local_1870;
  unsigned_long local_1868;
  unsigned_long uStack_1860;
  element_type *local_1850;
  unsigned_long local_1848;
  unsigned_long uStack_1840;
  element_type *local_1838;
  unsigned_long local_1830;
  unsigned_long local_1828;
  unsigned_long uStack_1820;
  unsigned_long local_1810;
  unsigned_long local_1808;
  uint local_17fc;
  element_type *local_17f8;
  unsigned_long local_17f0;
  unsigned_long local_17e8;
  unsigned_long uStack_17e0;
  uint local_17d4;
  element_type *local_17d0;
  unsigned_long local_17c8;
  int local_17bc;
  element_type *local_17b8;
  unsigned_long *local_17b0;
  unsigned_long local_17a8;
  unsigned_long uStack_17a0;
  unsigned_long local_1798;
  unsigned_long uStack_1790;
  unsigned_long local_1788;
  unsigned_long uStack_1780;
  unsigned_long local_1778;
  unsigned_long uStack_1770;
  unsigned_long local_1768;
  unsigned_long uStack_1760;
  unsigned_long local_1758;
  unsigned_long uStack_1750;
  unsigned_long local_1748;
  unsigned_long uStack_1740;
  unsigned_long local_1738;
  unsigned_long uStack_1730;
  element_type *local_1720;
  unsigned_long local_1718;
  unsigned_long uStack_1710;
  element_type *local_1700;
  unsigned_long local_16f8;
  unsigned_long uStack_16f0;
  element_type *local_16e0;
  unsigned_long local_16d8;
  unsigned_long uStack_16d0;
  element_type *local_16c0;
  unsigned_long local_16b8;
  unsigned_long uStack_16b0;
  element_type *local_16a0;
  unsigned_long local_1698;
  unsigned_long uStack_1690;
  element_type *local_1680;
  unsigned_long local_1678;
  unsigned_long uStack_1670;
  element_type *local_1660;
  unsigned_long local_1658;
  unsigned_long uStack_1650;
  element_type *local_1640;
  unsigned_long local_1638;
  unsigned_long uStack_1630;
  element_type *local_1620;
  unsigned_long local_1618;
  unsigned_long uStack_1610;
  element_type *local_1600;
  unsigned_long local_15f8;
  unsigned_long uStack_15f0;
  element_type *local_15e0;
  unsigned_long local_15d8;
  unsigned_long uStack_15d0;
  element_type *local_15c0;
  unsigned_long local_15b8;
  unsigned_long uStack_15b0;
  element_type *local_15a0;
  unsigned_long local_1598;
  unsigned_long uStack_1590;
  element_type *local_1588;
  unsigned_long local_1580;
  unsigned_long local_1578;
  unsigned_long uStack_1570;
  unsigned_long local_1568;
  unsigned_long local_1560;
  uint local_1554;
  element_type *local_1550;
  element_type *local_1548;
  element_type *local_1540;
  uint local_1534;
  element_type *local_1530;
  element_type *local_1528;
  element_type *local_1520;
  element_type eStack_1518;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  element_type *local_1490;
  element_type *local_1488;
  element_type *local_1480;
  __m128i b3_1;
  __m128i b2_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a3_1;
  __m128i a2_1;
  __m128i a1_1;
  __m128i a0_1;
  element_type *local_1030;
  element_type *local_1028;
  element_type *local_1020;
  unsigned_long local_c38;
  unsigned_long uStack_c30;
  uint local_c1c;
  element_type *local_c18;
  unsigned_long local_c10;
  element_type *local_c08;
  unsigned_long local_c00;
  unsigned_long local_bf8;
  unsigned_long uStack_bf0;
  unsigned_long local_be8;
  unsigned_long local_be0;
  int local_bd4;
  element_type *local_bd0;
  unsigned_long *local_bc8;
  element_type *local_bc0;
  element_type local_bb8;
  element_type eStack_bb0;
  element_type *local_ba0;
  element_type local_b98;
  element_type eStack_b90;
  element_type *local_b80;
  element_type local_b78;
  element_type eStack_b70;
  element_type *local_b60;
  element_type local_b58;
  element_type eStack_b50;
  element_type *local_b40;
  element_type local_b38;
  element_type eStack_b30;
  element_type *local_b20;
  element_type local_b18;
  element_type eStack_b10;
  element_type *local_b00;
  element_type local_af8;
  element_type eStack_af0;
  element_type *local_ae0;
  element_type local_ad8;
  element_type eStack_ad0;
  element_type *local_ac0;
  element_type local_ab8;
  element_type eStack_ab0;
  element_type *local_aa0;
  element_type local_a98;
  element_type eStack_a90;
  element_type *local_a80;
  element_type local_a78;
  element_type eStack_a70;
  element_type *local_a60;
  element_type local_a58;
  element_type eStack_a50;
  element_type *local_a40;
  element_type local_a38;
  element_type eStack_a30;
  element_type *local_a20;
  element_type local_a18;
  element_type eStack_a10;
  element_type *local_a00;
  element_type *local_9f8;
  element_type *local_9f0;
  element_type *local_9e8;
  element_type *local_9e0;
  element_type *local_9d8;
  element_type *local_9d0;
  element_type *local_9c8;
  element_type *local_9c0;
  element_type *local_9b8;
  element_type *local_9b0;
  element_type *local_9a8;
  element_type *local_9a0;
  element_type *local_998;
  element_type *local_990;
  unsigned_long local_988;
  unsigned_long uStack_980;
  element_type local_978;
  element_type eStack_970;
  unsigned_long local_968;
  unsigned_long uStack_960;
  element_type local_958;
  element_type eStack_950;
  unsigned_long local_948;
  unsigned_long uStack_940;
  element_type local_938;
  element_type eStack_930;
  unsigned_long local_928;
  unsigned_long uStack_920;
  element_type local_918;
  element_type eStack_910;
  unsigned_long local_908;
  unsigned_long uStack_900;
  element_type local_8f8;
  element_type eStack_8f0;
  unsigned_long local_8e8;
  unsigned_long uStack_8e0;
  element_type local_8d8;
  element_type eStack_8d0;
  unsigned_long local_8c8;
  unsigned_long uStack_8c0;
  element_type local_8b8;
  element_type eStack_8b0;
  uint local_8a4;
  element_type *local_8a0;
  unsigned_long local_898;
  element_type *local_890;
  unsigned_long local_888;
  unsigned_long uStack_880;
  uint local_86c;
  element_type *local_868;
  unsigned_long local_860;
  element_type *local_858;
  unsigned_long local_850;
  unsigned_long local_848;
  unsigned_long uStack_840;
  unsigned_long local_838;
  unsigned_long local_830;
  int local_824;
  element_type *local_820;
  unsigned_long *local_818;
  element_type *local_810;
  element_type local_808;
  element_type eStack_800;
  element_type *local_7f0;
  element_type local_7e8;
  element_type eStack_7e0;
  element_type *local_7d0;
  element_type local_7c8;
  element_type eStack_7c0;
  element_type *local_7b0;
  element_type local_7a8;
  element_type eStack_7a0;
  element_type *local_790;
  element_type local_788;
  element_type eStack_780;
  element_type *local_770;
  element_type local_768;
  element_type eStack_760;
  element_type *local_750;
  element_type local_748;
  element_type eStack_740;
  element_type *local_730;
  element_type local_728;
  element_type eStack_720;
  element_type *local_710;
  element_type local_708;
  element_type eStack_700;
  element_type *local_6f0;
  element_type local_6e8;
  element_type eStack_6e0;
  element_type *local_6d0;
  element_type local_6c8;
  element_type eStack_6c0;
  element_type *local_6b0;
  element_type local_6a8;
  element_type eStack_6a0;
  element_type *local_690;
  element_type local_688;
  element_type eStack_680;
  element_type *local_670;
  element_type local_668;
  element_type eStack_660;
  element_type *local_650;
  element_type *local_648;
  element_type *local_640;
  element_type *local_638;
  element_type *local_630;
  element_type *local_628;
  element_type *local_620;
  element_type *local_618;
  element_type *local_610;
  element_type *local_608;
  element_type *local_600;
  element_type *local_5f8;
  element_type *local_5f0;
  element_type *local_5e8;
  element_type *local_5e0;
  unsigned_long local_5d8;
  unsigned_long uStack_5d0;
  element_type local_5c8;
  element_type eStack_5c0;
  unsigned_long local_5b8;
  unsigned_long uStack_5b0;
  element_type local_5a8;
  element_type eStack_5a0;
  unsigned_long local_598;
  unsigned_long uStack_590;
  element_type local_588;
  element_type eStack_580;
  unsigned_long local_578;
  unsigned_long uStack_570;
  element_type local_568;
  element_type eStack_560;
  unsigned_long local_558;
  unsigned_long uStack_550;
  element_type local_548;
  element_type eStack_540;
  unsigned_long local_538;
  unsigned_long uStack_530;
  element_type local_528;
  element_type eStack_520;
  unsigned_long local_518;
  unsigned_long uStack_510;
  element_type local_508;
  element_type eStack_500;
  uint local_4f4;
  element_type *local_4f0;
  unsigned_long local_4e8;
  element_type *local_4e0;
  unsigned_long local_4d8;
  unsigned_long uStack_4d0;
  uint local_4bc;
  element_type *local_4b8;
  unsigned_long local_4b0;
  element_type *local_4a8;
  unsigned_long local_4a0;
  unsigned_long local_498;
  unsigned_long uStack_490;
  unsigned_long local_488;
  unsigned_long local_480;
  int local_474;
  element_type *local_470;
  unsigned_long *local_468;
  element_type *local_460;
  element_type local_458;
  element_type eStack_450;
  element_type *local_440;
  element_type local_438;
  element_type eStack_430;
  element_type *local_420;
  element_type local_418;
  element_type eStack_410;
  element_type *local_400;
  element_type local_3f8;
  element_type eStack_3f0;
  element_type *local_3e0;
  element_type local_3d8;
  element_type eStack_3d0;
  element_type *local_3c0;
  element_type local_3b8;
  element_type eStack_3b0;
  element_type *local_3a0;
  element_type local_398;
  element_type eStack_390;
  element_type *local_380;
  element_type local_378;
  element_type eStack_370;
  element_type *local_360;
  element_type local_358;
  element_type eStack_350;
  element_type *local_340;
  element_type local_338;
  element_type eStack_330;
  element_type *local_320;
  element_type local_318;
  element_type eStack_310;
  element_type *local_300;
  element_type local_2f8;
  element_type eStack_2f0;
  element_type *local_2e0;
  element_type local_2d8;
  element_type eStack_2d0;
  element_type *local_2c0;
  element_type local_2b8;
  element_type eStack_2b0;
  element_type *local_2a0;
  element_type *local_298;
  element_type *local_290;
  element_type *local_288;
  element_type *local_280;
  element_type *local_278;
  element_type *local_270;
  element_type *local_268;
  element_type *local_260;
  element_type *local_258;
  element_type *local_250;
  element_type *local_248;
  element_type *local_240;
  element_type *local_238;
  element_type *local_230;
  unsigned_long local_228;
  unsigned_long uStack_220;
  element_type local_218;
  element_type eStack_210;
  element_type local_208;
  element_type eStack_200;
  unsigned_long local_1f8;
  unsigned_long uStack_1f0;
  unsigned_long local_1e8;
  unsigned_long uStack_1e0;
  element_type local_1d8;
  element_type eStack_1d0;
  element_type local_1c8;
  element_type eStack_1c0;
  unsigned_long local_1b8;
  unsigned_long uStack_1b0;
  unsigned_long local_1a8;
  unsigned_long uStack_1a0;
  element_type local_198;
  element_type eStack_190;
  element_type local_188;
  element_type eStack_180;
  unsigned_long local_178;
  unsigned_long uStack_170;
  unsigned_long local_168;
  unsigned_long uStack_160;
  element_type local_158;
  element_type eStack_150;
  element_type local_148;
  element_type eStack_140;
  unsigned_long local_138;
  unsigned_long uStack_130;
  unsigned_long local_128;
  unsigned_long uStack_120;
  element_type local_118;
  element_type eStack_110;
  element_type local_108;
  element_type eStack_100;
  unsigned_long local_f8;
  unsigned_long uStack_f0;
  unsigned_long local_e8;
  unsigned_long uStack_e0;
  element_type local_d8;
  element_type eStack_d0;
  element_type local_c8;
  element_type eStack_c0;
  unsigned_long local_b8;
  unsigned_long uStack_b0;
  unsigned_long local_a8;
  unsigned_long uStack_a0;
  element_type local_98;
  element_type eStack_90;
  element_type local_88;
  element_type eStack_80;
  unsigned_long local_78;
  unsigned_long uStack_70;
  uint local_64;
  element_type *local_60;
  unsigned_long local_58;
  element_type *local_50;
  uint local_44;
  element_type *local_40;
  unsigned_long local_38;
  element_type *local_30;
  uint local_24;
  element_type *local_20;
  unsigned_long local_18;
  element_type *local_10;
  
  puVar17 = nosimd::common::malloc<unsigned_long>(length);
  std::shared_ptr<unsigned_long>::shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((shared_ptr<unsigned_long> *)
             &pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar17,
             nosimd::common::free<unsigned_long>);
  puVar17 = nosimd::common::malloc<unsigned_long>(length);
  std::shared_ptr<unsigned_long>::shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((shared_ptr<unsigned_long> *)local_1ae8,puVar17,nosimd::common::free<unsigned_long>);
  puVar17 = nosimd::common::malloc<unsigned_long>(length + 1);
  std::shared_ptr<unsigned_long>::shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((shared_ptr<unsigned_long> *)&v1,puVar17,nosimd::common::free<unsigned_long>);
  pSrc1 = std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)
                     &pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  pSrc2 = std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::get
                    ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)local_1ae8);
  pDst = std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)&v1);
  pDst[length] = 0x7f;
  local_17b0 = &local_17e8;
  iVar16 = (int)length >> 1;
  local_17b8 = pSrc1;
  for (local_17bc = iVar16; 3 < local_17bc; local_17bc = local_17bc + -4) {
    local_16c0 = local_17b8;
    local_15e0 = local_17b8;
    *local_17b8 = value1;
    local_17b8[1] = value1;
    local_16e0 = local_17b8 + 2;
    *local_16e0 = value1;
    local_17b8[3] = value1;
    local_1700 = local_17b8 + 4;
    *local_1700 = value1;
    local_17b8[5] = value1;
    local_1720 = local_17b8 + 6;
    *local_1720 = value1;
    local_17b8[7] = value1;
    local_17b8 = local_17b8 + 8;
    local_17a8 = value1;
    uStack_17a0 = value1;
    local_1798 = value1;
    uStack_1790 = value1;
    local_1788 = value1;
    uStack_1780 = value1;
    local_1778 = value1;
    uStack_1770 = value1;
    local_1738 = value1;
    uStack_1730 = value1;
    local_1718 = value1;
    uStack_1710 = value1;
    local_16f8 = value1;
    uStack_16f0 = value1;
    local_16d8 = value1;
    uStack_16d0 = value1;
    local_15f8 = value1;
    uStack_15f0 = value1;
    local_15d8 = value1;
    uStack_15d0 = value1;
    local_15c0 = local_16e0;
    local_15b8 = value1;
    uStack_15b0 = value1;
    local_15a0 = local_1700;
    local_1598 = value1;
    uStack_1590 = value1;
    local_1588 = local_1720;
  }
  if (1 < local_17bc) {
    local_1680 = local_17b8;
    local_1620 = local_17b8;
    *local_17b8 = value1;
    local_17b8[1] = value1;
    local_16a0 = local_17b8 + 2;
    *local_16a0 = value1;
    local_17b8[3] = value1;
    local_17bc = local_17bc + -2;
    local_17b8 = local_17b8 + 4;
    local_1768 = value1;
    uStack_1760 = value1;
    local_1758 = value1;
    uStack_1750 = value1;
    local_16b8 = value1;
    uStack_16b0 = value1;
    local_1698 = value1;
    uStack_1690 = value1;
    local_1638 = value1;
    uStack_1630 = value1;
    local_1618 = value1;
    uStack_1610 = value1;
    local_1600 = local_16a0;
  }
  if (local_17bc != 0) {
    local_1660 = local_17b8;
    local_1640 = local_17b8;
    *local_17b8 = value1;
    local_17b8[1] = value1;
    local_1748 = value1;
    uStack_1740 = value1;
    local_1678 = value1;
    uStack_1670 = value1;
    local_1658 = value1;
    uStack_1650 = value1;
  }
  if (length != 0) {
    pSrc1[(int)(length - 1)] = value1;
  }
  local_1a60 = &local_1a98;
  local_1a68 = pSrc2;
  for (local_1a6c = iVar16; 3 < local_1a6c; local_1a6c = local_1a6c + -4) {
    local_1970 = local_1a68;
    local_1890 = local_1a68;
    *local_1a68 = value2;
    local_1a68[1] = value2;
    local_1990 = local_1a68 + 2;
    *local_1990 = value2;
    local_1a68[3] = value2;
    local_19b0 = local_1a68 + 4;
    *local_19b0 = value2;
    local_1a68[5] = value2;
    local_19d0 = local_1a68 + 6;
    *local_19d0 = value2;
    local_1a68[7] = value2;
    local_1a68 = local_1a68 + 8;
    local_1a58 = value2;
    uStack_1a50 = value2;
    local_1a48 = value2;
    uStack_1a40 = value2;
    local_1a38 = value2;
    uStack_1a30 = value2;
    local_1a28 = value2;
    uStack_1a20 = value2;
    local_19e8 = value2;
    uStack_19e0 = value2;
    local_19c8 = value2;
    uStack_19c0 = value2;
    local_19a8 = value2;
    uStack_19a0 = value2;
    local_1988 = value2;
    uStack_1980 = value2;
    local_18a8 = value2;
    uStack_18a0 = value2;
    local_1888 = value2;
    uStack_1880 = value2;
    local_1870 = local_1990;
    local_1868 = value2;
    uStack_1860 = value2;
    local_1850 = local_19b0;
    local_1848 = value2;
    uStack_1840 = value2;
    local_1838 = local_19d0;
  }
  if (1 < local_1a6c) {
    local_1930 = local_1a68;
    local_18d0 = local_1a68;
    *local_1a68 = value2;
    local_1a68[1] = value2;
    local_1950 = local_1a68 + 2;
    *local_1950 = value2;
    local_1a68[3] = value2;
    local_1a6c = local_1a6c + -2;
    local_1a68 = local_1a68 + 4;
    local_1a18 = value2;
    uStack_1a10 = value2;
    local_1a08 = value2;
    uStack_1a00 = value2;
    local_1968 = value2;
    uStack_1960 = value2;
    local_1948 = value2;
    uStack_1940 = value2;
    local_18e8 = value2;
    uStack_18e0 = value2;
    local_18c8 = value2;
    uStack_18c0 = value2;
    local_18b0 = local_1950;
  }
  if (local_1a6c != 0) {
    local_1910 = local_1a68;
    local_18f0 = local_1a68;
    *local_1a68 = value2;
    local_1a68[1] = value2;
    local_19f8 = value2;
    uStack_19f0 = value2;
    local_1928 = value2;
    uStack_1920 = value2;
    local_1908 = value2;
    uStack_1900 = value2;
  }
  if (length != 0) {
    pSrc2[(int)(length - 1)] = value2;
  }
  local_1a98 = value2;
  uStack_1a90 = value2;
  local_1a84 = length;
  local_1a80 = pSrc2;
  local_1a78 = value2;
  local_1830 = value2;
  local_1828 = value2;
  uStack_1820 = value2;
  local_1810 = value2;
  local_1808 = value2;
  local_17fc = length;
  local_17f8 = pSrc1;
  local_17f0 = value1;
  local_17e8 = value1;
  uStack_17e0 = value1;
  local_17d4 = length;
  local_17d0 = pSrc1;
  local_17c8 = value1;
  local_1580 = value1;
  local_1578 = value1;
  uStack_1570 = value1;
  local_1568 = value1;
  local_1560 = value1;
  for (r._4_4_ = 0; r._4_4_ < length; r._4_4_ = r._4_4_ + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pSrc1[r._4_4_],value1);
    if ((!bVar15) ||
       (bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pSrc2[r._4_4_],value2), !bVar15)) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x1a;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_1490 = pDst;
  local_1488 = pSrc2;
  local_1480 = pSrc1;
  for (a0[1]._4_4_ = iVar16; 3 < a0[1]._4_4_; a0[1]._4_4_ = a0[1]._4_4_ + -4) {
    eVar1 = local_1480[1];
    eVar2 = local_1480[2];
    eVar3 = local_1480[3];
    eVar4 = local_1480[4];
    eVar5 = local_1480[5];
    eVar6 = local_1480[6];
    eVar7 = local_1480[7];
    eVar8 = local_1488[1];
    eVar9 = local_1488[2];
    eVar10 = local_1488[3];
    b3[1] = local_1488[4];
    eVar11 = local_1488[5];
    eStack_1518 = local_1488[6];
    b3[0] = local_1488[7];
    *local_1490 = *local_1480 + *local_1488;
    local_1490[1] = eVar1 + eVar8;
    local_1490[2] = eVar2 + eVar9;
    local_1490[3] = eVar3 + eVar10;
    local_1490[4] = eVar4 + b3[1];
    local_1490[5] = eVar5 + eVar11;
    local_1490[6] = eVar6 + eStack_1518;
    local_1490[7] = eVar7 + b3[0];
    local_1480 = local_1480 + 8;
    local_1488 = local_1488 + 8;
    local_1490 = local_1490 + 8;
  }
  if (1 < a0[1]._4_4_) {
    eVar1 = local_1480[1];
    eVar2 = local_1488[1];
    *local_1490 = *local_1480 + *local_1488;
    local_1490[1] = eVar1 + eVar2;
    eVar1 = local_1480[3];
    eVar2 = local_1488[3];
    local_1490[2] = local_1480[2] + local_1488[2];
    local_1490[3] = eVar1 + eVar2;
    a0[1]._4_4_ = a0[1]._4_4_ + -2;
    local_1480 = local_1480 + 4;
    local_1488 = local_1488 + 4;
    local_1490 = local_1490 + 4;
  }
  if (a0[1]._4_4_ != 0) {
    eVar1 = local_1480[1];
    eVar2 = local_1488[1];
    *local_1490 = *local_1480 + *local_1488;
    local_1490[1] = eVar1 + eVar2;
  }
  if (length != 0) {
    pDst[(int)(length - 1)] = pSrc1[(int)(length - 1)] + pSrc2[(int)(length - 1)];
  }
  local_1554 = length;
  local_1550 = pDst;
  local_1548 = pSrc2;
  local_1540 = pSrc1;
  local_1534 = length;
  local_1530 = pDst;
  local_1528 = pSrc2;
  local_1520 = pSrc1;
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_3],value1 + value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x22;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_1030 = pDst;
  local_1028 = pSrc2;
  local_1020 = pSrc1;
  for (a0_1[1]._4_4_ = iVar16; 3 < a0_1[1]._4_4_; a0_1[1]._4_4_ = a0_1[1]._4_4_ + -4) {
    eVar1 = local_1020[1];
    eVar2 = local_1020[2];
    eVar3 = local_1020[3];
    eVar4 = local_1020[4];
    eVar5 = local_1020[5];
    eVar6 = local_1020[6];
    eVar7 = local_1020[7];
    eVar8 = local_1028[1];
    eVar9 = local_1028[2];
    eVar10 = local_1028[3];
    eVar11 = local_1028[4];
    eVar12 = local_1028[5];
    eVar13 = local_1028[6];
    eVar14 = local_1028[7];
    *local_1030 = *local_1020 - *local_1028;
    local_1030[1] = eVar1 - eVar8;
    local_1030[2] = eVar2 - eVar9;
    local_1030[3] = eVar3 - eVar10;
    local_1030[4] = eVar4 - eVar11;
    local_1030[5] = eVar5 - eVar12;
    local_1030[6] = eVar6 - eVar13;
    local_1030[7] = eVar7 - eVar14;
    local_1020 = local_1020 + 8;
    local_1028 = local_1028 + 8;
    local_1030 = local_1030 + 8;
  }
  if (1 < a0_1[1]._4_4_) {
    eVar1 = local_1020[1];
    eVar2 = local_1028[1];
    *local_1030 = *local_1020 - *local_1028;
    local_1030[1] = eVar1 - eVar2;
    eVar1 = local_1020[3];
    eVar2 = local_1028[3];
    local_1030[2] = local_1020[2] - local_1028[2];
    local_1030[3] = eVar1 - eVar2;
    a0_1[1]._4_4_ = a0_1[1]._4_4_ + -2;
    local_1020 = local_1020 + 4;
    local_1028 = local_1028 + 4;
    local_1030 = local_1030 + 4;
  }
  if (a0_1[1]._4_4_ != 0) {
    eVar1 = local_1020[1];
    eVar2 = local_1028[1];
    *local_1030 = *local_1020 - *local_1028;
    local_1030[1] = eVar1 - eVar2;
  }
  if (length != 0) {
    pDst[(int)(length - 1)] = pSrc1[(int)(length - 1)] - pSrc2[(int)(length - 1)];
  }
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_4],value1 - value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x2a;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::mul<unsigned_long>(pSrc1,pSrc2,pDst,length);
  for (i_5 = 0; i_5 < length; i_5 = i_5 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_5],value1 * value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x32;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  nosimd::arithmetic::div<unsigned_long>(pSrc1,pSrc2,pDst,length);
  for (i_6 = 0; i_6 < length; i_6 = i_6 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_6],value1 / value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x3a;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_bc8 = &local_c38;
  local_bd0 = pDst;
  local_bc0 = pSrc1;
  for (local_bd4 = iVar16; 3 < local_bd4; local_bd4 = local_bd4 + -4) {
    local_ae0 = local_bd0;
    local_9c8 = local_bc0;
    local_9c0 = local_bc0;
    local_8b8 = *local_bc0;
    eStack_8b0 = local_bc0[1];
    local_af8 = local_8b8 + value2;
    eStack_af0 = eStack_8b0 + value2;
    local_ac0 = local_bd0;
    *local_bd0 = local_af8;
    local_bd0[1] = eStack_af0;
    local_b00 = local_bd0 + 2;
    local_9d0 = local_bc0 + 2;
    local_8d8 = *local_9d0;
    eStack_8d0 = local_bc0[3];
    local_b18 = local_8d8 + value2;
    eStack_b10 = eStack_8d0 + value2;
    *local_b00 = local_b18;
    local_bd0[3] = eStack_b10;
    local_b20 = local_bd0 + 4;
    local_9d8 = local_bc0 + 4;
    local_8f8 = *local_9d8;
    eStack_8f0 = local_bc0[5];
    local_b38 = local_8f8 + value2;
    eStack_b30 = eStack_8f0 + value2;
    *local_b20 = local_b38;
    local_bd0[5] = eStack_b30;
    local_b40 = local_bd0 + 6;
    local_9e0 = local_bc0 + 6;
    local_918 = *local_9e0;
    eStack_910 = local_bc0[7];
    local_b58 = local_918 + value2;
    eStack_b50 = eStack_910 + value2;
    *local_b40 = local_b58;
    local_bd0[7] = eStack_b50;
    local_bc0 = local_bc0 + 8;
    local_bd0 = local_bd0 + 8;
    local_ad8 = local_af8;
    eStack_ad0 = eStack_af0;
    local_ab8 = local_b18;
    eStack_ab0 = eStack_b10;
    local_aa0 = local_b00;
    local_a98 = local_b38;
    eStack_a90 = eStack_b30;
    local_a80 = local_b20;
    local_a78 = local_b58;
    eStack_a70 = eStack_b50;
    local_a60 = local_b40;
    local_9b8 = local_9d0;
    local_9b0 = local_9d8;
    local_9a8 = local_9e0;
    local_928 = value2;
    uStack_920 = value2;
    local_908 = value2;
    uStack_900 = value2;
    local_8e8 = value2;
    uStack_8e0 = value2;
    local_8c8 = value2;
    uStack_8c0 = value2;
  }
  if (1 < local_bd4) {
    local_9e8 = local_bc0;
    local_9a0 = local_bc0;
    local_938 = *local_bc0;
    eStack_930 = local_bc0[1];
    local_b78 = local_938 + value2;
    eStack_b70 = eStack_930 + value2;
    local_b60 = local_bd0;
    local_a40 = local_bd0;
    *local_bd0 = local_b78;
    local_bd0[1] = eStack_b70;
    local_b80 = local_bd0 + 2;
    local_9f0 = local_bc0 + 2;
    local_958 = *local_9f0;
    eStack_950 = local_bc0[3];
    local_b98 = local_958 + value2;
    eStack_b90 = eStack_950 + value2;
    *local_b80 = local_b98;
    local_bd0[3] = eStack_b90;
    local_bd4 = local_bd4 + -2;
    local_bc0 = local_bc0 + 4;
    local_bd0 = local_bd0 + 4;
    local_a58 = local_b78;
    eStack_a50 = eStack_b70;
    local_a38 = local_b98;
    eStack_a30 = eStack_b90;
    local_a20 = local_b80;
    local_998 = local_9f0;
    local_968 = value2;
    uStack_960 = value2;
    local_948 = value2;
    uStack_940 = value2;
  }
  if (local_bd4 != 0) {
    local_9f8 = local_bc0;
    local_990 = local_bc0;
    local_978 = *local_bc0;
    eStack_970 = local_bc0[1];
    local_bb8 = local_978 + value2;
    eStack_bb0 = eStack_970 + value2;
    local_ba0 = local_bd0;
    local_a00 = local_bd0;
    *local_bd0 = local_bb8;
    local_bd0[1] = eStack_bb0;
    local_a18 = local_bb8;
    eStack_a10 = eStack_bb0;
    local_988 = value2;
    uStack_980 = value2;
  }
  if (length != 0) {
    pDst[(int)(length - 1)] = pSrc1[(int)(length - 1)] + value2;
  }
  local_c38 = value2;
  uStack_c30 = value2;
  local_c1c = length;
  local_c18 = pDst;
  local_c10 = value2;
  local_c08 = pSrc1;
  local_c00 = value2;
  local_bf8 = value2;
  uStack_bf0 = value2;
  local_be8 = value2;
  local_be0 = value2;
  for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_7],value1 + value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x43;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_818 = &local_888;
  local_820 = pDst;
  local_810 = pSrc1;
  for (local_824 = iVar16; 3 < local_824; local_824 = local_824 + -4) {
    local_730 = local_820;
    local_618 = local_810;
    local_610 = local_810;
    local_508 = *local_810;
    eStack_500 = local_810[1];
    local_748 = local_508 - value2;
    eStack_740 = eStack_500 - value2;
    local_710 = local_820;
    *local_820 = local_748;
    local_820[1] = eStack_740;
    local_750 = local_820 + 2;
    local_620 = local_810 + 2;
    local_528 = *local_620;
    eStack_520 = local_810[3];
    local_768 = local_528 - value2;
    eStack_760 = eStack_520 - value2;
    *local_750 = local_768;
    local_820[3] = eStack_760;
    local_770 = local_820 + 4;
    local_628 = local_810 + 4;
    local_548 = *local_628;
    eStack_540 = local_810[5];
    local_788 = local_548 - value2;
    eStack_780 = eStack_540 - value2;
    *local_770 = local_788;
    local_820[5] = eStack_780;
    local_790 = local_820 + 6;
    local_630 = local_810 + 6;
    local_568 = *local_630;
    eStack_560 = local_810[7];
    local_7a8 = local_568 - value2;
    eStack_7a0 = eStack_560 - value2;
    *local_790 = local_7a8;
    local_820[7] = eStack_7a0;
    local_810 = local_810 + 8;
    local_820 = local_820 + 8;
    local_728 = local_748;
    eStack_720 = eStack_740;
    local_708 = local_768;
    eStack_700 = eStack_760;
    local_6f0 = local_750;
    local_6e8 = local_788;
    eStack_6e0 = eStack_780;
    local_6d0 = local_770;
    local_6c8 = local_7a8;
    eStack_6c0 = eStack_7a0;
    local_6b0 = local_790;
    local_608 = local_620;
    local_600 = local_628;
    local_5f8 = local_630;
    local_578 = value2;
    uStack_570 = value2;
    local_558 = value2;
    uStack_550 = value2;
    local_538 = value2;
    uStack_530 = value2;
    local_518 = value2;
    uStack_510 = value2;
  }
  if (1 < local_824) {
    local_638 = local_810;
    local_5f0 = local_810;
    local_588 = *local_810;
    eStack_580 = local_810[1];
    local_7c8 = local_588 - value2;
    eStack_7c0 = eStack_580 - value2;
    local_7b0 = local_820;
    local_690 = local_820;
    *local_820 = local_7c8;
    local_820[1] = eStack_7c0;
    local_7d0 = local_820 + 2;
    local_640 = local_810 + 2;
    local_5a8 = *local_640;
    eStack_5a0 = local_810[3];
    local_7e8 = local_5a8 - value2;
    eStack_7e0 = eStack_5a0 - value2;
    *local_7d0 = local_7e8;
    local_820[3] = eStack_7e0;
    local_824 = local_824 + -2;
    local_810 = local_810 + 4;
    local_820 = local_820 + 4;
    local_6a8 = local_7c8;
    eStack_6a0 = eStack_7c0;
    local_688 = local_7e8;
    eStack_680 = eStack_7e0;
    local_670 = local_7d0;
    local_5e8 = local_640;
    local_5b8 = value2;
    uStack_5b0 = value2;
    local_598 = value2;
    uStack_590 = value2;
  }
  if (local_824 != 0) {
    local_648 = local_810;
    local_5e0 = local_810;
    local_5c8 = *local_810;
    eStack_5c0 = local_810[1];
    local_808 = local_5c8 - value2;
    eStack_800 = eStack_5c0 - value2;
    local_7f0 = local_820;
    local_650 = local_820;
    *local_820 = local_808;
    local_820[1] = eStack_800;
    local_668 = local_808;
    eStack_660 = eStack_800;
    local_5d8 = value2;
    uStack_5d0 = value2;
  }
  if (length != 0) {
    pDst[(int)(length - 1)] = pSrc1[(int)(length - 1)] - value2;
  }
  for (i_8 = 0; local_8a4 = length, local_8a0 = pDst, local_898 = value2, local_890 = pSrc1,
      local_888 = value2, uStack_880 = value2, local_86c = length, local_868 = pDst,
      local_860 = value2, local_858 = pSrc1, local_850 = value2, local_848 = value2,
      uStack_840 = value2, local_838 = value2, local_830 = value2, i_8 < length; i_8 = i_8 + 1) {
    if (pDst[i_8] != value1 - value2) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x4b;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_468 = &local_4d8;
  local_470 = pDst;
  local_460 = pSrc1;
  for (local_474 = iVar16; 3 < local_474; local_474 = local_474 + -4) {
    local_380 = local_470;
    local_268 = local_460;
    local_260 = local_460;
    local_158 = *local_460;
    eStack_150 = local_460[1];
    local_398 = value2 - local_158;
    eStack_390 = value2 - eStack_150;
    local_360 = local_470;
    *local_470 = local_398;
    local_470[1] = eStack_390;
    local_3a0 = local_470 + 2;
    local_270 = local_460 + 2;
    local_198 = *local_270;
    eStack_190 = local_460[3];
    local_3b8 = value2 - local_198;
    eStack_3b0 = value2 - eStack_190;
    *local_3a0 = local_3b8;
    local_470[3] = eStack_3b0;
    local_3c0 = local_470 + 4;
    local_278 = local_460 + 4;
    local_1d8 = *local_278;
    eStack_1d0 = local_460[5];
    local_3d8 = value2 - local_1d8;
    eStack_3d0 = value2 - eStack_1d0;
    *local_3c0 = local_3d8;
    local_470[5] = eStack_3d0;
    local_3e0 = local_470 + 6;
    local_280 = local_460 + 6;
    local_218 = *local_280;
    eStack_210 = local_460[7];
    local_3f8 = value2 - local_218;
    eStack_3f0 = value2 - eStack_210;
    *local_3e0 = local_3f8;
    local_470[7] = eStack_3f0;
    local_460 = local_460 + 8;
    local_470 = local_470 + 8;
    local_378 = local_398;
    eStack_370 = eStack_390;
    local_358 = local_3b8;
    eStack_350 = eStack_3b0;
    local_340 = local_3a0;
    local_338 = local_3d8;
    eStack_330 = eStack_3d0;
    local_320 = local_3c0;
    local_318 = local_3f8;
    eStack_310 = eStack_3f0;
    local_300 = local_3e0;
    local_258 = local_270;
    local_250 = local_278;
    local_248 = local_280;
    local_228 = value2;
    uStack_220 = value2;
    local_208 = local_218;
    eStack_200 = eStack_210;
    local_1f8 = value2;
    uStack_1f0 = value2;
    local_1e8 = value2;
    uStack_1e0 = value2;
    local_1c8 = local_1d8;
    eStack_1c0 = eStack_1d0;
    local_1b8 = value2;
    uStack_1b0 = value2;
    local_1a8 = value2;
    uStack_1a0 = value2;
    local_188 = local_198;
    eStack_180 = eStack_190;
    local_178 = value2;
    uStack_170 = value2;
    local_168 = value2;
    uStack_160 = value2;
    local_148 = local_158;
    eStack_140 = eStack_150;
    local_138 = value2;
    uStack_130 = value2;
  }
  if (1 < local_474) {
    local_288 = local_460;
    local_240 = local_460;
    local_d8 = *local_460;
    eStack_d0 = local_460[1];
    local_418 = value2 - local_d8;
    eStack_410 = value2 - eStack_d0;
    local_400 = local_470;
    local_2e0 = local_470;
    *local_470 = local_418;
    local_470[1] = eStack_410;
    local_420 = local_470 + 2;
    local_290 = local_460 + 2;
    local_118 = *local_290;
    eStack_110 = local_460[3];
    local_438 = value2 - local_118;
    eStack_430 = value2 - eStack_110;
    *local_420 = local_438;
    local_470[3] = eStack_430;
    local_474 = local_474 + -2;
    local_460 = local_460 + 4;
    local_470 = local_470 + 4;
    local_2f8 = local_418;
    eStack_2f0 = eStack_410;
    local_2d8 = local_438;
    eStack_2d0 = eStack_430;
    local_2c0 = local_420;
    local_238 = local_290;
    local_128 = value2;
    uStack_120 = value2;
    local_108 = local_118;
    eStack_100 = eStack_110;
    local_f8 = value2;
    uStack_f0 = value2;
    local_e8 = value2;
    uStack_e0 = value2;
    local_c8 = local_d8;
    eStack_c0 = eStack_d0;
    local_b8 = value2;
    uStack_b0 = value2;
  }
  if (local_474 != 0) {
    local_298 = local_460;
    local_230 = local_460;
    local_98 = *local_460;
    eStack_90 = local_460[1];
    local_458 = value2 - local_98;
    eStack_450 = value2 - eStack_90;
    local_440 = local_470;
    local_2a0 = local_470;
    *local_470 = local_458;
    local_470[1] = eStack_450;
    local_2b8 = local_458;
    eStack_2b0 = eStack_450;
    local_a8 = value2;
    uStack_a0 = value2;
    local_88 = local_98;
    eStack_80 = eStack_90;
    local_78 = value2;
    uStack_70 = value2;
  }
  if (length != 0) {
    pDst[(int)(length - 1)] = value2 - pSrc1[(int)(length - 1)];
  }
  local_4f4 = length;
  local_4f0 = pDst;
  local_4e8 = value2;
  local_4e0 = pSrc1;
  local_4d8 = value2;
  uStack_4d0 = value2;
  local_4bc = length;
  local_4b8 = pDst;
  local_4b0 = value2;
  local_4a8 = pSrc1;
  local_4a0 = value2;
  local_498 = value2;
  uStack_490 = value2;
  local_488 = value2;
  local_480 = value2;
  for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[i_9],value2 - value1);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x53;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_64 = length;
  local_60 = pDst;
  local_58 = value2;
  local_50 = pSrc1;
  nosimd::arithmetic::mulC<unsigned_long>(pSrc1,value2,pDst,length);
  for (i_10 = 0; i_10 < length; i_10 = i_10 + 1) {
    if (pDst[i_10] != value1 * value2) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x5b;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_44 = length;
  local_40 = pDst;
  local_38 = value2;
  local_30 = pSrc1;
  nosimd::arithmetic::divC<unsigned_long>(pSrc1,value2,pDst,length);
  for (local_1b54 = 0; local_1b54 < length; local_1b54 = local_1b54 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[local_1b54],value1 / value2);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 99;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  local_24 = length;
  local_20 = pDst;
  local_18 = value2;
  local_10 = pSrc1;
  nosimd::arithmetic::divCRev<unsigned_long>(pSrc1,value2,pDst,length);
  for (local_1b58 = 0; local_1b58 < length; local_1b58 = local_1b58 + 1) {
    bVar15 = anon_unknown.dwarf_1996d::equal<unsigned_long>(pDst[local_1b58],value2 / value1);
    if (!bVar15) {
      puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
      *(undefined4 *)(puVar18 + 1) = 0x6b;
      *(uint *)((long)puVar18 + 0xc) = length;
      __cxa_throw(puVar18,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) && (pDst[length] != 0x7f)) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar18 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned long]";
    *(undefined4 *)(puVar18 + 1) = 0x70;
    *(uint *)((long)puVar18 + 0xc) = length;
    __cxa_throw(puVar18,&Exception::typeinfo,0);
  }
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)&v1);
  std::shared_ptr<unsigned_long>::~shared_ptr((shared_ptr<unsigned_long> *)local_1ae8);
  std::shared_ptr<unsigned_long>::~shared_ptr
            ((shared_ptr<unsigned_long> *)
             &pv2.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}